

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O2

int fe_parse_general_params(cmd_ln_t *config,fe_t *fe)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  uint8 uVar7;
  ulong uVar8;
  double dVar9;
  
  fe->config = config;
  dVar9 = cmd_ln_float_r(config,"-samprate");
  fe->sampling_rate = (float32)(float)dVar9;
  uVar4 = cmd_ln_int_r(config,"-frate");
  iVar2 = (int)uVar4;
  if (((0x7fff < iVar2) || (iVar2 < 1)) || ((float)fe->sampling_rate < (float)iVar2)) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
            ,0x4a,"Frame rate %d can not be bigger than sample rate %.02f\n",
            (double)(float)fe->sampling_rate,uVar4 & 0xffffffff);
  }
  else {
    fe->frame_rate = (int16)uVar4;
    lVar5 = cmd_ln_int_r(config,"-dither");
    if (lVar5 != 0) {
      fe->dither = '\x01';
      lVar5 = cmd_ln_int_r(config,"-seed");
      fe->dither_seed = (int32)lVar5;
    }
    pcVar6 = cmd_ln_str_r(config,"-input_endian");
    iVar2 = strcmp("little",pcVar6);
    fe->swap = iVar2 != 0;
    dVar9 = cmd_ln_float_r(config,"-wlen");
    fe->window_length = (float32)(float)dVar9;
    dVar9 = cmd_ln_float_r(config,"-alpha");
    fe->pre_emphasis_alpha = (float32)(float)dVar9;
    lVar5 = cmd_ln_int_r(config,"-ncep");
    fe->num_cepstra = (uint8)lVar5;
    lVar5 = cmd_ln_int_r(config,"-nfft");
    sVar1 = (short)lVar5;
    fe->fft_size = sVar1;
    uVar7 = '\0';
    uVar8 = (ulong)(uint)(int)sVar1;
    for (uVar4 = uVar8; 1 < (int)(uint)uVar4; uVar4 = (ulong)((uint)uVar4 >> 1)) {
      if (((uVar4 & 1) != 0) || (sVar1 < 1)) {
        fe->fft_order = uVar7;
        pcVar6 = "fft: number of points must be a power of 2 (is %d)\n";
        lVar5 = 0x62;
        goto LAB_0012b64a;
      }
      uVar7 = uVar7 + '\x01';
    }
    fe->fft_order = uVar7;
    uVar3 = (uint)((float)fe->window_length * (float)fe->sampling_rate);
    if ((int)uVar3 <= (int)sVar1) {
      lVar5 = cmd_ln_int_r(config,"-vad_prespeech");
      fe->pre_speech = (int16)lVar5;
      lVar5 = cmd_ln_int_r(config,"-vad_postspeech");
      fe->post_speech = (int16)lVar5;
      lVar5 = cmd_ln_int_r(config,"-vad_startspeech");
      fe->start_speech = (int16)lVar5;
      dVar9 = cmd_ln_float_r(config,"-vad_threshold");
      fe->vad_threshold = (float32)(float)dVar9;
      lVar5 = cmd_ln_int_r(config,"-remove_dc");
      fe->remove_dc = lVar5 != 0;
      lVar5 = cmd_ln_int_r(config,"-remove_noise");
      fe->remove_noise = lVar5 != 0;
      lVar5 = cmd_ln_int_r(config,"-remove_silence");
      fe->remove_silence = lVar5 != 0;
      pcVar6 = cmd_ln_str_r(config,"-transform");
      iVar2 = strcmp(pcVar6,"dct");
      if (iVar2 == 0) {
        uVar7 = '\x01';
      }
      else {
        pcVar6 = cmd_ln_str_r(config,"-transform");
        iVar2 = strcmp(pcVar6,"legacy");
        if (iVar2 == 0) {
          uVar7 = '\0';
        }
        else {
          pcVar6 = cmd_ln_str_r(config,"-transform");
          iVar2 = strcmp(pcVar6,"htk");
          if (iVar2 != 0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
                    ,0x7d,"Invalid transform type (values are \'dct\', \'legacy\', \'htk\')\n");
            return -1;
          }
          uVar7 = '\x02';
        }
      }
      fe->transform = uVar7;
      lVar5 = cmd_ln_int_r(config,"-logspec");
      if (lVar5 != 0) {
        fe->log_spec = '\x01';
      }
      lVar5 = cmd_ln_int_r(config,"-smoothspec");
      if (lVar5 != 0) {
        fe->log_spec = '\x02';
        return 0;
      }
      return 0;
    }
    pcVar6 = "FFT: Number of points must be greater or equal to frame size (%d samples)\n";
    lVar5 = 0x69;
    uVar8 = (ulong)uVar3;
LAB_0012b64a:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_interface.c"
            ,lVar5,pcVar6,uVar8);
  }
  return -1;
}

Assistant:

int
fe_parse_general_params(cmd_ln_t *config, fe_t * fe)
{
    int j, frate;

    fe->config = config;
    fe->sampling_rate = cmd_ln_float32_r(config, "-samprate");
    frate = cmd_ln_int32_r(config, "-frate");
    if (frate > MAX_INT16 || frate > fe->sampling_rate || frate < 1) {
        E_ERROR
            ("Frame rate %d can not be bigger than sample rate %.02f\n",
             frate, fe->sampling_rate);
        return -1;
    }

    fe->frame_rate = (int16)frate;
    if (cmd_ln_boolean_r(config, "-dither")) {
        fe->dither = 1;
        fe->dither_seed = cmd_ln_int32_r(config, "-seed");
    }
#ifdef WORDS_BIGENDIAN
    fe->swap = strcmp("big", cmd_ln_str_r(config, "-input_endian")) == 0 ? 0 : 1;
#else        
    fe->swap = strcmp("little", cmd_ln_str_r(config, "-input_endian")) == 0 ? 0 : 1;
#endif
    fe->window_length = cmd_ln_float32_r(config, "-wlen");
    fe->pre_emphasis_alpha = cmd_ln_float32_r(config, "-alpha");

    fe->num_cepstra = (uint8)cmd_ln_int32_r(config, "-ncep");
    fe->fft_size = (int16)cmd_ln_int32_r(config, "-nfft");

    /* Check FFT size, compute FFT order (log_2(n)) */
    for (j = fe->fft_size, fe->fft_order = 0; j > 1; j >>= 1, fe->fft_order++) {
        if (((j % 2) != 0) || (fe->fft_size <= 0)) {
            E_ERROR("fft: number of points must be a power of 2 (is %d)\n",
                    fe->fft_size);
            return -1;
        }
    }
    /* Verify that FFT size is greater or equal to window length. */
    if (fe->fft_size < (int)(fe->window_length * fe->sampling_rate)) {
        E_ERROR("FFT: Number of points must be greater or equal to frame size (%d samples)\n",
                (int)(fe->window_length * fe->sampling_rate));
        return -1;
    }

    fe->pre_speech = (int16)cmd_ln_int32_r(config, "-vad_prespeech");
    fe->post_speech = (int16)cmd_ln_int32_r(config, "-vad_postspeech");
    fe->start_speech = (int16)cmd_ln_int32_r(config, "-vad_startspeech");
    fe->vad_threshold = cmd_ln_float32_r(config, "-vad_threshold");

    fe->remove_dc = cmd_ln_boolean_r(config, "-remove_dc");
    fe->remove_noise = cmd_ln_boolean_r(config, "-remove_noise");
    fe->remove_silence = cmd_ln_boolean_r(config, "-remove_silence");

    if (0 == strcmp(cmd_ln_str_r(config, "-transform"), "dct"))
        fe->transform = DCT_II;
    else if (0 == strcmp(cmd_ln_str_r(config, "-transform"), "legacy"))
        fe->transform = LEGACY_DCT;
    else if (0 == strcmp(cmd_ln_str_r(config, "-transform"), "htk"))
        fe->transform = DCT_HTK;
    else {
        E_ERROR("Invalid transform type (values are 'dct', 'legacy', 'htk')\n");
        return -1;
    }

    if (cmd_ln_boolean_r(config, "-logspec"))
        fe->log_spec = RAW_LOG_SPEC;
    if (cmd_ln_boolean_r(config, "-smoothspec"))
        fe->log_spec = SMOOTH_LOG_SPEC;

    return 0;
}